

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetectorOutput.h
# Opt level: O1

void __thiscall DetectorOutput::~DetectorOutput(DetectorOutput *this)

{
  Detector *pDVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Hash_node_base *p_Var2;
  
  (**(code **)(*(long *)(this->_det)._M_t.
                        super___uniq_ptr_impl<Detector,_std::default_delete<Detector>_>._M_t.
                        super__Tuple_impl<0UL,_Detector_*,_std::default_delete<Detector>_>.
                        super__Head_base<0UL,_Detector_*,_false>._M_head_impl + 0x20))();
  for (p_Var2 = (this->tls)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
    if (p_Var2[2]._M_nxt != (_Hash_node_base *)0x0) {
      operator_delete(p_Var2[2]._M_nxt,8);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"finished ",9);
  pDVar1 = (this->_det)._M_t.super___uniq_ptr_impl<Detector,_std::default_delete<Detector>_>._M_t.
           super__Tuple_impl<0UL,_Detector_*,_std::default_delete<Detector>_>.
           super__Head_base<0UL,_Detector_*,_false>._M_head_impl;
  if (pDVar1 != (Detector *)0x0) {
    (**(code **)(*(long *)pDVar1 + 0x10))();
  }
  (this->_det)._M_t.super___uniq_ptr_impl<Detector,_std::default_delete<Detector>_>._M_t.
  super__Tuple_impl<0UL,_Detector_*,_std::default_delete<Detector>_>.
  super__Head_base<0UL,_Detector_*,_false>._M_head_impl = (Detector *)0x0;
  this_00 = (this->_libdetector).super___shared_ptr<util::LibraryLoader,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_void_**>,_std::allocator<std::pair<const_unsigned_int,_void_**>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_void_**>,_std::allocator<std::pair<const_unsigned_int,_void_**>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)this);
  return;
}

Assistant:

~DetectorOutput() {
    _det->finalize();
    for (auto it = tls.begin(); it != tls.end(); it++) {
      delete it->second;
    }
    std::cout << "finished ";
  }